

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O3

void __thiscall FNotifyBuffer::Draw(FNotifyBuffer *this)

{
  FNotifyText *pFVar1;
  bool bVar2;
  bool bVar3;
  FFont *font;
  DFrameBuffer *this_00;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int normalcolor;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  double dVar15;
  
  bVar3 = con_centernotify.Value;
  if (1 < (uint)(gamestate + GS_FORCEWIPEBURN)) {
    iVar13 = SmallFont->FontHeight;
    if (con_scaletext.Value == 1) {
      iVar11 = 1;
      if (uiscale.Value == 0) {
        iVar11 = CleanYfac;
      }
      iVar13 = iVar13 * iVar11;
    }
    iVar11 = this->Top;
    BorderTopRefresh =
         (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
    uVar4 = (this->Text).Count;
    if (uVar4 != 0) {
      bVar2 = true;
      lVar12 = 8;
      uVar6 = 0;
      do {
        this_00 = screen;
        font = SmallFont;
        pFVar1 = (this->Text).Array;
        iVar14 = *(int *)((long)pFVar1 + lVar12 + -8);
        if (iVar14 != 0) {
          uVar7 = iVar14 - gametic;
          if (uVar7 == 0 || iVar14 < gametic) {
            if (bVar2) {
              this->Top = this->Top + iVar13;
              iVar11 = iVar11 + iVar13;
            }
            *(undefined4 *)((long)pFVar1 + lVar12 + -8) = 0;
          }
          else {
            iVar14 = *(int *)((long)pFVar1 + lVar12 + -4);
            if ((show_messages.Value != false) || (iVar14 == 0x80)) {
              dVar15 = (double)(int)uVar7 / 6.0;
              if (5 < uVar7) {
                dVar15 = 1.0;
              }
              normalcolor = 0xb;
              if (iVar14 < 5) {
                normalcolor = PrintColors[iVar14];
              }
              if (con_scaletext.Value - 2U < 2) {
LAB_003544a3:
                if (bVar3) {
                  iVar14 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                  iVar5 = FFont::StringWidth(SmallFont,*(BYTE **)((long)&pFVar1->TimeOut + lVar12));
                  if (con_scaletext.Value == 3) {
                    iVar14 = iVar14 + iVar5 * -4;
                    iVar5 = iVar14 + 7;
                    if (-1 < iVar14) {
                      iVar5 = iVar14;
                    }
                    iVar5 = iVar5 >> 3;
                    iVar14 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                    iVar9 = iVar14 + 3;
                    if (-1 < iVar14) {
                      iVar9 = iVar14;
                    }
                    uVar10 = (ulong)(uint)(iVar9 >> 2);
                    iVar14 = 4;
                  }
                  else if (con_scaletext.Value == 2) {
                    iVar14 = iVar14 + iVar5 * -2;
                    iVar5 = iVar14 + 3;
                    if (-1 < iVar14) {
                      iVar5 = iVar14;
                    }
                    iVar5 = iVar5 >> 2;
                    uVar10 = (ulong)(uint)((screen->super_DSimpleCanvas).super_DCanvas.Width / 2);
                    iVar14 = 2;
                  }
                  else if (con_scaletext.Value == 1) {
                    iVar14 = iVar14 - iVar5 * uiscale.Value;
                    iVar5 = (int)(CONCAT44(iVar14 - (iVar14 >> 0x1f) >> 0x1f,iVar14 / 2) /
                                 (long)uiscale.Value);
                    uVar10 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width /
                             (long)uiscale.Value & 0xffffffff;
                    iVar14 = uiscale.Value;
                  }
                  else {
                    iVar5 = (iVar14 - iVar5) / 2;
                    uVar10 = (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width;
                    iVar14 = 1;
                  }
                  DCanvas::DrawText((DCanvas *)this_00,font,normalcolor,iVar5,iVar11,
                                    *(char **)((long)&pFVar1->TimeOut + lVar12),0x40001399,dVar15,
                                    uVar10,0x4000139a,
                                    (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                                    (long)iVar14 & 0xffffffff,0x400013a8,1,0x4000138c,0);
                }
                else {
                  if (con_scaletext.Value == 3) {
                    iVar14 = 4;
                  }
                  else {
                    iVar14 = con_scaletext.Value;
                    if (con_scaletext.Value != 2) {
                      iVar14 = uiscale.Value;
                    }
                  }
                  DCanvas::DrawText((DCanvas *)screen,SmallFont,normalcolor,0,iVar11,
                                    *(char **)((long)&pFVar1->TimeOut + lVar12),0x40001399,
                                    (long)(screen->super_DSimpleCanvas).super_DCanvas.Width /
                                    (long)iVar14 & 0xffffffff,0x4000139a,
                                    (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                                    (long)iVar14 & 0xffffffff,0x400013a8,1,0x4000138c,0);
                }
              }
              else if ((con_scaletext.Value == 1) && (uiscale.Value != 1)) {
                if (uiscale.Value != 0) goto LAB_003544a3;
                if (bVar3) {
                  iVar14 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                  iVar5 = FFont::StringWidth(SmallFont,*(BYTE **)((long)&pFVar1->TimeOut + lVar12));
                  iVar14 = (iVar14 - iVar5 * CleanXfac) / 2;
                  pcVar8 = *(char **)((long)&pFVar1->TimeOut + lVar12);
                }
                else {
                  pcVar8 = *(char **)((long)&pFVar1->TimeOut + lVar12);
                  iVar14 = 0;
                }
                DCanvas::DrawText((DCanvas *)this_00,font,normalcolor,iVar14,iVar11,pcVar8,
                                  0x40001393,dVar15,1,0x4000138c,0);
              }
              else {
                if (bVar3) {
                  iVar14 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                  iVar5 = FFont::StringWidth(SmallFont,*(BYTE **)((long)&pFVar1->TimeOut + lVar12));
                  iVar14 = (iVar14 - iVar5) / 2;
                  pcVar8 = *(char **)((long)&pFVar1->TimeOut + lVar12);
                }
                else {
                  pcVar8 = *(char **)((long)&pFVar1->TimeOut + lVar12);
                  iVar14 = 0;
                }
                DCanvas::DrawText((DCanvas *)this_00,font,normalcolor,iVar14,iVar11,pcVar8,
                                  0x4000138c,dVar15,0);
              }
              iVar11 = iVar11 + iVar13;
              uVar4 = (this->Text).Count;
              bVar2 = false;
            }
          }
        }
        uVar6 = uVar6 + 1;
        lVar12 = lVar12 + 0x10;
      } while (uVar6 < uVar4);
      if (!bVar2) {
        return;
      }
    }
    this->Top = this->TopGoal;
  }
  return;
}

Assistant:

void FNotifyBuffer::Draw()
{
	bool center = (con_centernotify != 0.f);
	int line, lineadv, color, j;
	bool canskip;
	
	if (gamestate == GS_FULLCONSOLE || gamestate == GS_DEMOSCREEN/* || menuactive != MENU_Off*/)
		return;

	line = Top;
	canskip = true;

	lineadv = SmallFont->GetHeight ();
	if (active_con_scaletext() == 0)
	{
		lineadv *= CleanYfac;
	}

	BorderTopRefresh = screen->GetPageCount ();

	for (unsigned i = 0; i < Text.Size(); ++ i)
	{
		FNotifyText &notify = Text[i];

		if (notify.TimeOut == 0)
			continue;

		j = notify.TimeOut - gametic;
		if (j > 0)
		{
			if (!show_messages && notify.PrintLevel != 128)
				continue;

			double alpha = (j < NOTIFYFADETIME) ? 1. * j / NOTIFYFADETIME : 1;

			if (notify.PrintLevel >= PRINTLEVELS)
				color = CR_UNTRANSLATED;
			else
				color = PrintColors[notify.PrintLevel];

			if (active_con_scaletext() == 0)
			{
				if (!center)
					screen->DrawText (SmallFont, color, 0, line, notify.Text,
						DTA_CleanNoMove, true, DTA_AlphaF, alpha, TAG_DONE);
				else
					screen->DrawText (SmallFont, color, (SCREENWIDTH -
						SmallFont->StringWidth (notify.Text)*CleanXfac)/2,
						line, notify.Text, DTA_CleanNoMove, true,
						DTA_AlphaF, alpha, TAG_DONE);
			}
			else if (active_con_scaletext() == 1)
			{
				if (!center)
					screen->DrawText (SmallFont, color, 0, line, notify.Text,
						DTA_AlphaF, alpha, TAG_DONE);
				else
					screen->DrawText (SmallFont, color, (SCREENWIDTH -
						SmallFont->StringWidth (notify.Text))/2,
						line, notify.Text,
						DTA_AlphaF, alpha, TAG_DONE);
			}
			else
			{
				if (!center)
					screen->DrawText (SmallFont, color, 0, line, notify.Text,
						DTA_VirtualWidth, screen->GetWidth() / active_con_scaletext(),
						DTA_VirtualHeight, screen->GetHeight() / active_con_scaletext(),
						DTA_KeepRatio, true,
						DTA_AlphaF, alpha, TAG_DONE);
				else
					screen->DrawText (SmallFont, color, (screen->GetWidth() -
						SmallFont->StringWidth (notify.Text) * active_con_scaletext()) / 2 / active_con_scaletext(),
						line, notify.Text,
						DTA_VirtualWidth, screen->GetWidth() / active_con_scaletext(),
						DTA_VirtualHeight, screen->GetHeight() / active_con_scaletext(),
						DTA_KeepRatio, true,
						DTA_AlphaF, alpha, TAG_DONE);
			}
			line += lineadv;
			canskip = false;
		}
		else
		{
			if (canskip)
			{
				Top += lineadv;
				line += lineadv;
			}
			notify.TimeOut = 0;
		}
	}
	if (canskip)
	{
		Top = TopGoal;
	}
}